

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O0

err_t cmdSigRead(cmd_sig_t *sig,size_t *sig_len,char *sig_name)

{
  blob_t buf;
  size_t sVar1;
  size_t *in_RSI;
  octet *der;
  size_t count;
  size_t in_stack_00000010;
  err_t code;
  octet *in_stack_00000030;
  cmd_sig_t *in_stack_00000038;
  size_t in_stack_ffffffffffffffc8;
  undefined8 local_30;
  undefined4 local_24;
  undefined4 local_4;
  
  local_4 = cmdFileSuffixRead(sig->sig,sig_len,sig_name,in_stack_00000010);
  if (local_4 == 0) {
    buf = blobCreate(in_stack_ffffffffffffffc8);
    local_4 = 0x6e;
    if (buf != (blob_t)0x0) {
      local_4 = 0;
    }
    if (local_4 == 0) {
      local_24 = cmdFileSuffixRead(sig->sig,sig_len,sig_name,in_stack_00000010);
      if (local_24 == 0) {
        memRev(buf,local_30);
        sVar1 = cmdSigDec(in_stack_00000038,in_stack_00000030,(size_t)sig);
        if (sVar1 == local_30) {
          if (in_RSI != (size_t *)0x0) {
            *in_RSI = local_30;
          }
        }
        else {
          local_24 = 0x1fe;
        }
        blobClose((blob_t)0x108cdf);
        local_4 = local_24;
      }
      else {
        blobClose((blob_t)0x108c83);
        local_4 = local_24;
      }
    }
  }
  return local_4;
}

Assistant:

err_t cmdSigRead(cmd_sig_t* sig, size_t* sig_len, const char* sig_name)
{
	err_t code;
	size_t count;
	octet* der;
	// pre
	ASSERT(memIsValid(sig, sizeof(cmd_sig_t)));
	ASSERT(memIsNullOrValid(sig_len, O_PER_S));
	ASSERT(strIsValid(sig_name));
	// определить длину суффикса
	code = cmdFileSuffixRead(0, &count, sig_name, 0);
	ERR_CALL_CHECK(code);
	// прочитать суффикс
	code = cmdBlobCreate(der, count);
	ERR_CALL_CHECK(code);
	code = cmdFileSuffixRead(der, &count, sig_name, 0);
	ERR_CALL_HANDLE(code, cmdBlobClose(der));
	// декодировать
	memRev(der, count);
	if (cmdSigDec(sig, der, count) != count)
		code = ERR_BAD_SIG;
	else if (sig_len)
		*sig_len = count;
	// завершить
	cmdBlobClose(der);
	return code;
}